

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

ArgumentMismatch *
CLI::ArgumentMismatch::AtMost
          (ArgumentMismatch *__return_storage_ptr__,string *name,int num,size_t received)

{
  string local_f8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t received_local;
  string *psStack_18;
  int num_local;
  string *name_local;
  
  local_28 = received;
  received_local._4_4_ = num;
  psStack_18 = name;
  name_local = (string *)__return_storage_ptr__;
  ::std::operator+(&local_a8,name,": At Most ");
  std::__cxx11::to_string(&local_c8,received_local._4_4_);
  ::std::operator+(&local_88,&local_a8,&local_c8);
  ::std::operator+(&local_68,&local_88," required but received ");
  std::__cxx11::to_string(&local_f8,local_28);
  ::std::operator+(&local_48,&local_68,&local_f8);
  ArgumentMismatch(__return_storage_ptr__,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

static ArgumentMismatch AtMost(std::string name, int num, std::size_t received) {
        return ArgumentMismatch(name + ": At Most " + std::to_string(num) + " required but received " +
                                std::to_string(received));
    }